

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int client_close_proxy(archive_read_filter *self)

{
  int iVar1;
  int iVar2;
  archive_read *paVar3;
  ulong uVar4;
  long lVar5;
  
  paVar3 = self->archive;
  if ((paVar3->client).closer == (undefined1 *)0x0) {
    iVar2 = 0;
  }
  else {
    lVar5 = 0x10;
    iVar2 = 0;
    for (uVar4 = 0; uVar4 < (paVar3->client).nodes; uVar4 = uVar4 + 1) {
      iVar1 = (*(code *)(paVar3->client).closer)
                        (paVar3,*(undefined8 *)
                                 ((long)&((paVar3->client).dataset)->begin_position + lVar5));
      if (iVar1 <= iVar2) {
        iVar2 = iVar1;
      }
      paVar3 = self->archive;
      lVar5 = lVar5 + 0x18;
    }
  }
  return iVar2;
}

Assistant:

static int
client_close_proxy(struct archive_read_filter *self)
{
	int r = ARCHIVE_OK, r2;
	unsigned int i;

	if (self->archive->client.closer == NULL)
		return (r);
	for (i = 0; i < self->archive->client.nodes; i++)
	{
		r2 = (self->archive->client.closer)
			((struct archive *)self->archive,
				self->archive->client.dataset[i].data);
		if (r > r2)
			r = r2;
	}
	return (r);
}